

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# excp_helper.c
# Opt level: O0

hwaddr get_hphys(CPUState *cs,hwaddr gphys,MMUAccessType access_type,int *prot)

{
  uint32_t uVar1;
  hwaddr hVar2;
  ulong uVar3;
  uint local_a4;
  uint64_t uStack_a0;
  uint32_t pde_1;
  uint64_t pml4e;
  uint64_t pml4e_addr;
  uint64_t pml5e;
  target_ulong pdpe_addr;
  uint64_t pdpe;
  uint64_t pde;
  int page_size;
  uint32_t page_offset;
  target_ulong pte_addr;
  target_ulong pde_addr;
  uint64_t exit_info_1;
  uint64_t pte;
  uint64_t ptep;
  uint64_t rsvd_mask;
  CPUX86State *env;
  int *prot_local;
  MMUAccessType access_type_local;
  hwaddr gphys_local;
  CPUState *cs_local;
  
  ptep = 0xfff0000000000;
  pde_addr = 0;
  if ((*(uint *)((long)cs[1].tb_jmp_cache + 0x80c) & 0x40) == 0) {
    return gphys;
  }
  if (((ulong)cs[1].tb_jmp_cache[0x39d] & 4) == 0) {
    ptep = 0x800fff0000000000;
  }
  if (((ulong)cs[1].tb_jmp_cache[0x39d] & 1) == 0) {
    hVar2 = ((ulong)cs[1].tb_jmp_cache[0x39c] & 0xfffffffffffff000) + (gphys >> 0x14 & 0xffc);
    local_a4 = x86_ldl_phys_x86_64(cs,hVar2);
    if ((local_a4 & 1) == 0) goto LAB_0051c300;
    pte = (ulong)local_a4 | 0x8000000000000000;
    if (((local_a4 & 0x80) == 0) || (((ulong)cs[1].tb_jmp_cache[0x124] & 0x10) == 0)) {
      if ((local_a4 & 0x20) == 0) {
        local_a4 = local_a4 | 0x20;
        x86_stl_phys_notdirty_x86_64(cs,hVar2,local_a4);
      }
      uVar1 = x86_ldl_phys_x86_64(cs,(ulong)(local_a4 & 0xfffff000) + (gphys >> 10 & 0xffc));
      exit_info_1 = (uint64_t)uVar1;
      if ((uVar1 & 1) == 0) goto LAB_0051c300;
      pte = (exit_info_1 | 0x8000000000000000) & pte;
      ptep = 0;
LAB_0051c1fd:
      pde._0_4_ = 0x1000;
LAB_0051c1ff:
      ptep = (long)((int)pde + -1) & 0xfffffffffe000U | ptep;
    }
    else {
      pde._0_4_ = 0x400000;
      exit_info_1 = (ulong)local_a4 | ((ulong)local_a4 & 0x1fe000) << 0x13;
      ptep = 0x200000;
    }
    if ((exit_info_1 & ptep) != 0) goto LAB_0051c2e8;
    uVar3 = pte ^ 0x8000000000000000;
    if ((uVar3 & 4) != 0) {
      if ((uVar3 & 0x8000000000000000) != 0) {
        if (access_type == MMU_INST_FETCH) goto LAB_0051c2f4;
        *prot = *prot & 0xfffffffb;
      }
      if ((uVar3 & 2) != 0) {
LAB_0051c2a2:
        return ((long)(int)((int)pde - 1U ^ 0xffffffff) & 0xffffffffff000U & exit_info_1) +
               (ulong)((uint)gphys & (int)pde - 1U);
      }
      if (access_type != MMU_DATA_STORE) {
        *prot = *prot & 0xfffffffd;
        goto LAB_0051c2a2;
      }
    }
  }
  else {
    if (((ulong)cs[1].tb_jmp_cache[0x39d] & 2) == 0) {
      pdpe_addr = x86_ldq_phys_x86_64(cs,((ulong)cs[1].tb_jmp_cache[0x39c] & 0xffffffffffffffe0) +
                                         (gphys >> 0x1b & 0x18));
      if ((pdpe_addr & 1) == 0) goto LAB_0051c300;
      if ((pdpe_addr & (ptep | 0xfff0000000000000)) == 0) {
        pte = 0x8000000000000006;
        ptep = ptep | 0x7ff0000000000000;
LAB_0051bf4d:
        hVar2 = (pdpe_addr & 0xffffffffff000) + (gphys >> 0x15 & 0x1ff) * 8;
        pdpe = x86_ldq_phys_x86_64(cs,hVar2);
        if ((pdpe & 1) == 0) goto LAB_0051c300;
        if ((pdpe & ptep) == 0) {
          pte = (pdpe ^ 0x8000000000000000) & pte;
          if ((pdpe & 0x80) != 0) {
            pde._0_4_ = 0x200000;
            exit_info_1 = pdpe;
            goto LAB_0051c1ff;
          }
          if ((pdpe & 0x20) == 0) {
            pdpe = pdpe | 0x20;
            x86_stl_phys_notdirty_x86_64(cs,hVar2,(uint32_t)pdpe);
          }
          exit_info_1 = x86_ldq_phys_x86_64(cs,(pdpe & 0xffffffffff000) + (gphys >> 0xc & 0x1ff) * 8
                                           );
          if ((exit_info_1 & 1) == 0) goto LAB_0051c300;
          if ((exit_info_1 & ptep) == 0) {
            pte = (exit_info_1 ^ 0x8000000000000000) & pte;
            goto LAB_0051c1fd;
          }
        }
      }
    }
    else {
      hVar2 = ((ulong)cs[1].tb_jmp_cache[0x39c] & 0xffffffffff000) + (gphys >> 0x27 & 0x1ff) * 8;
      uStack_a0 = x86_ldq_phys_x86_64(cs,hVar2);
      if ((uStack_a0 & 1) == 0) goto LAB_0051c300;
      if ((uStack_a0 & (ptep | 0x80)) == 0) {
        if ((uStack_a0 & 0x20) == 0) {
          uStack_a0 = uStack_a0 | 0x20;
          x86_stl_phys_notdirty_x86_64(cs,hVar2,(uint32_t)uStack_a0);
        }
        hVar2 = (uStack_a0 & 0xffffffffff000) + (gphys >> 0x1e & 0x1ff) * 8;
        pdpe_addr = x86_ldq_phys_x86_64(cs,hVar2);
        if ((pdpe_addr & 1) == 0) goto LAB_0051c300;
        if ((pdpe_addr & ptep) == 0) {
          pte = (pdpe_addr ^ 0x8000000000000000) &
                (uStack_a0 ^ 0x8000000000000000) & 0x8000000000000006;
          if ((pdpe_addr & 0x20) == 0) {
            pdpe_addr = pdpe_addr | 0x20;
            x86_stl_phys_notdirty_x86_64(cs,hVar2,(uint32_t)pdpe_addr);
          }
          if ((pdpe_addr & 0x80) == 0) goto LAB_0051bf4d;
          pde._0_4_ = 0x40000000;
          exit_info_1 = pdpe_addr;
          goto LAB_0051c1ff;
        }
      }
    }
LAB_0051c2e8:
    pde_addr = 8;
  }
LAB_0051c2f4:
  pde_addr = pde_addr | 1;
LAB_0051c300:
  x86_stq_phys_x86_64(cs,(hwaddr)(cs[1].tb_jmp_cache[0x397]->jmp_list_next + 1),gphys);
  if (access_type == MMU_DATA_STORE) {
    uVar3 = pde_addr | 6;
  }
  else {
    uVar3 = pde_addr | 4;
    if (access_type == MMU_INST_FETCH) {
      uVar3 = pde_addr | 0x14;
    }
  }
  pde_addr = uVar3;
  if (prot == (int *)0x0) {
    pde_addr = pde_addr | 0x200000000;
  }
  else {
    pde_addr = pde_addr | 0x100000000;
  }
  cpu_vmexit_x86_64((CPUX86State *)(cs[1].tb_jmp_cache + 0xeb),0x400,pde_addr,
                    (uintptr_t)cs[1].tb_jmp_cache[0x39e]);
}

Assistant:

static hwaddr get_hphys(CPUState *cs, hwaddr gphys, MMUAccessType access_type,
                        int *prot)
{
    CPUX86State *env = &X86_CPU(cs)->env;
    uint64_t rsvd_mask = PG_HI_RSVD_MASK;
    uint64_t ptep, pte;
    uint64_t exit_info_1 = 0;
    target_ulong pde_addr, pte_addr;
    uint32_t page_offset;
    int page_size;

    if (likely(!(env->hflags2 & HF2_NPT_MASK))) {
        return gphys;
    }

    if (!(env->nested_pg_mode & SVM_NPT_NXE)) {
        rsvd_mask |= PG_NX_MASK;
    }

    if (env->nested_pg_mode & SVM_NPT_PAE) {
        uint64_t pde, pdpe;
        target_ulong pdpe_addr;

#ifdef TARGET_X86_64
        if (env->nested_pg_mode & SVM_NPT_LMA) {
            uint64_t pml5e;
            uint64_t pml4e_addr, pml4e;

            pml5e = env->nested_cr3;
            ptep = PG_NX_MASK | PG_USER_MASK | PG_RW_MASK;

            pml4e_addr = (pml5e & PG_ADDRESS_MASK) +
                    (((gphys >> 39) & 0x1ff) << 3);
            pml4e = x86_ldq_phys(cs, pml4e_addr);
            if (!(pml4e & PG_PRESENT_MASK)) {
                goto do_fault;
            }
            if (pml4e & (rsvd_mask | PG_PSE_MASK)) {
                goto do_fault_rsvd;
            }
            if (!(pml4e & PG_ACCESSED_MASK)) {
                pml4e |= PG_ACCESSED_MASK;
                x86_stl_phys_notdirty(cs, pml4e_addr, pml4e);
            }
            ptep &= pml4e ^ PG_NX_MASK;
            pdpe_addr = (pml4e & PG_ADDRESS_MASK) +
                    (((gphys >> 30) & 0x1ff) << 3);
            pdpe = x86_ldq_phys(cs, pdpe_addr);
            if (!(pdpe & PG_PRESENT_MASK)) {
                goto do_fault;
            }
            if (pdpe & rsvd_mask) {
                goto do_fault_rsvd;
            }
            ptep &= pdpe ^ PG_NX_MASK;
            if (!(pdpe & PG_ACCESSED_MASK)) {
                pdpe |= PG_ACCESSED_MASK;
                x86_stl_phys_notdirty(cs, pdpe_addr, pdpe);
            }
            if (pdpe & PG_PSE_MASK) {
                /* 1 GB page */
                page_size = 1024 * 1024 * 1024;
                pte_addr = pdpe_addr;
                pte = pdpe;
                goto do_check_protect;
            }
        } else
#endif
        {
            pdpe_addr = (env->nested_cr3 & ~0x1f) + ((gphys >> 27) & 0x18);
            pdpe = x86_ldq_phys(cs, pdpe_addr);
            if (!(pdpe & PG_PRESENT_MASK)) {
                goto do_fault;
            }
            rsvd_mask |= PG_HI_USER_MASK;
            if (pdpe & (rsvd_mask | PG_NX_MASK)) {
                goto do_fault_rsvd;
            }
            ptep = PG_NX_MASK | PG_USER_MASK | PG_RW_MASK;
        }

        pde_addr = (pdpe & PG_ADDRESS_MASK) + (((gphys >> 21) & 0x1ff) << 3);
        pde = x86_ldq_phys(cs, pde_addr);
        if (!(pde & PG_PRESENT_MASK)) {
            goto do_fault;
        }
        if (pde & rsvd_mask) {
            goto do_fault_rsvd;
        }
        ptep &= pde ^ PG_NX_MASK;
        if (pde & PG_PSE_MASK) {
            /* 2 MB page */
            page_size = 2048 * 1024;
            pte_addr = pde_addr;
            pte = pde;
            goto do_check_protect;
        }
        /* 4 KB page */
        if (!(pde & PG_ACCESSED_MASK)) {
            pde |= PG_ACCESSED_MASK;
            x86_stl_phys_notdirty(cs, pde_addr, pde);
        }
        pte_addr = (pde & PG_ADDRESS_MASK) + (((gphys >> 12) & 0x1ff) << 3);
        pte = x86_ldq_phys(cs, pte_addr);
        if (!(pte & PG_PRESENT_MASK)) {
            goto do_fault;
        }
        if (pte & rsvd_mask) {
            goto do_fault_rsvd;
        }
        /* combine pde and pte nx, user and rw protections */
        ptep &= pte ^ PG_NX_MASK;
        page_size = 4096;
    } else {
        uint32_t pde;

        /* page directory entry */
        pde_addr = (env->nested_cr3 & ~0xfff) + ((gphys >> 20) & 0xffc);
        pde = x86_ldl_phys(cs, pde_addr);
        if (!(pde & PG_PRESENT_MASK)) {
            goto do_fault;
        }
        ptep = pde | PG_NX_MASK;

        /* if PSE bit is set, then we use a 4MB page */
        if ((pde & PG_PSE_MASK) && (env->cr[4] & CR4_PSE_MASK)) {
            page_size = 4096 * 1024;
            pte_addr = pde_addr;

            /* Bits 20-13 provide bits 39-32 of the address, bit 21 is reserved.
             * Leave bits 20-13 in place for setting accessed/dirty bits below.
             */
            pte = pde | ((pde & 0x1fe000LL) << (32 - 13));
            rsvd_mask = 0x200000;
            goto do_check_protect_pse36;
        }

        if (!(pde & PG_ACCESSED_MASK)) {
            pde |= PG_ACCESSED_MASK;
            x86_stl_phys_notdirty(cs, pde_addr, pde);
        }

        /* page directory entry */
        pte_addr = (pde & ~0xfff) + ((gphys >> 10) & 0xffc);
        pte = x86_ldl_phys(cs, pte_addr);
        if (!(pte & PG_PRESENT_MASK)) {
            goto do_fault;
        }
        /* combine pde and pte user and rw protections */
        ptep &= pte | PG_NX_MASK;
        page_size = 4096;
        rsvd_mask = 0;
    }

 do_check_protect:
    rsvd_mask |= (page_size - 1) & PG_ADDRESS_MASK & ~PG_PSE_PAT_MASK;
 do_check_protect_pse36:
    if (pte & rsvd_mask) {
        goto do_fault_rsvd;
    }
    ptep ^= PG_NX_MASK;

    if (!(ptep & PG_USER_MASK)) {
        goto do_fault_protect;
    }
    if (ptep & PG_NX_MASK) {
        if (access_type == MMU_INST_FETCH) {
            goto do_fault_protect;
        }
        *prot &= ~PAGE_EXEC;
    }
    if (!(ptep & PG_RW_MASK)) {
        if (access_type == MMU_DATA_STORE) {
            goto do_fault_protect;
        }
        *prot &= ~PAGE_WRITE;
    }

    pte &= PG_ADDRESS_MASK & ~(page_size - 1);
    page_offset = gphys & (page_size - 1);
    return pte + page_offset;

 do_fault_rsvd:
    exit_info_1 |= SVM_NPTEXIT_RSVD;
 do_fault_protect:
    exit_info_1 |= SVM_NPTEXIT_P;
 do_fault:
    x86_stq_phys(cs, env->vm_vmcb + offsetof(struct vmcb, control.exit_info_2),
                 gphys);
    exit_info_1 |= SVM_NPTEXIT_US;
    if (access_type == MMU_DATA_STORE) {
        exit_info_1 |= SVM_NPTEXIT_RW;
    } else if (access_type == MMU_INST_FETCH) {
        exit_info_1 |= SVM_NPTEXIT_ID;
    }
    if (prot) {
        exit_info_1 |= SVM_NPTEXIT_GPA;
    } else { /* page table access */
        exit_info_1 |= SVM_NPTEXIT_GPT;
    }
    cpu_vmexit(env, SVM_EXIT_NPF, exit_info_1, env->retaddr);
}